

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O3

drwav_uint64 drwav_read_pcm_frames_be(drwav *pWav,drwav_uint64 framesToRead,void *pBufferOut)

{
  ushort *puVar1;
  undefined1 uVar2;
  ushort uVar3;
  ulong uVar4;
  uint uVar5;
  drwav_uint64 dVar6;
  long lVar7;
  undefined1 *puVar8;
  long lVar9;
  
  dVar6 = drwav_read_pcm_frames_le(pWav,framesToRead,pBufferOut);
  if (pBufferOut != (void *)0x0) {
    if ((pWav->bitsPerSample & 7) == 0) {
      uVar5 = (uint)(pWav->fmt).channels * (uint)pWav->bitsPerSample >> 3;
    }
    else {
      uVar5 = (uint)(pWav->fmt).blockAlign;
    }
    lVar9 = pWav->channels * dVar6;
    uVar5 = uVar5 / pWav->channels;
    uVar3 = pWav->translatedFormatTag;
    if (uVar3 - 6 < 2) {
      if (lVar9 != 0) {
        lVar7 = 0;
        do {
          puVar1 = (ushort *)((long)pBufferOut + lVar7 * 2);
          *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
          lVar7 = lVar7 + 1;
        } while (lVar9 - lVar7 != 0);
      }
    }
    else if (uVar3 == 3) {
      if (uVar5 == 4) {
        if (lVar9 != 0) {
          lVar7 = 0;
          do {
            uVar5 = *(uint *)((long)pBufferOut + lVar7 * 4);
            *(uint *)((long)pBufferOut + lVar7 * 4) =
                 uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
            lVar7 = lVar7 + 1;
          } while (lVar9 - lVar7 != 0);
        }
      }
      else {
        if (uVar5 != 8) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/dr_wav.h"
                        ,0x56d,"void drwav__bswap_samples_ieee(void *, drwav_uint64, drwav_uint32)")
          ;
        }
        if (lVar9 != 0) {
          lVar7 = 0;
          do {
            uVar4 = *(ulong *)((long)pBufferOut + lVar7 * 8);
            *(ulong *)((long)pBufferOut + lVar7 * 8) =
                 uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 |
                 (uVar4 & 0xff0000000000) >> 0x18 | (uVar4 & 0xff00000000) >> 8 |
                 (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 | (uVar4 & 0xff00) << 0x28 |
                 uVar4 << 0x38;
            lVar7 = lVar7 + 1;
          } while (lVar9 - lVar7 != 0);
        }
      }
    }
    else {
      if (uVar3 != 1) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/dr_wav.h"
                      ,0x58b,
                      "void drwav__bswap_samples(void *, drwav_uint64, drwav_uint32, drwav_uint16)")
        ;
      }
      if (uVar5 == 2) {
        if (lVar9 != 0) {
          lVar7 = 0;
          do {
            puVar1 = (ushort *)((long)pBufferOut + lVar7 * 2);
            *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
            lVar7 = lVar7 + 1;
          } while (lVar9 - lVar7 != 0);
        }
      }
      else if (uVar5 == 3) {
        if (lVar9 != 0) {
          puVar8 = (undefined1 *)((long)pBufferOut + 2);
          do {
            uVar2 = puVar8[-2];
            puVar8[-2] = *puVar8;
            *puVar8 = uVar2;
            puVar8 = puVar8 + 3;
            lVar9 = lVar9 + -1;
          } while (lVar9 != 0);
        }
      }
      else {
        if (uVar5 != 4) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/dr_wav.h"
                        ,0x553,"void drwav__bswap_samples_pcm(void *, drwav_uint64, drwav_uint32)");
        }
        if (lVar9 != 0) {
          lVar7 = 0;
          do {
            uVar5 = *(uint *)((long)pBufferOut + lVar7 * 4);
            *(uint *)((long)pBufferOut + lVar7 * 4) =
                 uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
            lVar7 = lVar7 + 1;
          } while (lVar9 - lVar7 != 0);
        }
      }
    }
  }
  return dVar6;
}

Assistant:

DRWAV_API drwav_uint64 drwav_read_pcm_frames_be(drwav* pWav, drwav_uint64 framesToRead, void* pBufferOut)
{
    drwav_uint64 framesRead = drwav_read_pcm_frames_le(pWav, framesToRead, pBufferOut);

    if (pBufferOut != NULL) {
        drwav__bswap_samples(pBufferOut, framesRead*pWav->channels, drwav_get_bytes_per_pcm_frame(pWav)/pWav->channels, pWav->translatedFormatTag);
    }

    return framesRead;
}